

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O3

value_type __thiscall djb::microfacet::eval(microfacet *this,vec3 *wi,vec3 *wo,void *user_args)

{
  undefined4 uVar1;
  undefined4 uVar2;
  _func_int **pp_Var3;
  impl *piVar4;
  long lVar5;
  float *extraout_RDX;
  float *extraout_RDX_00;
  float *pfVar6;
  _func_int **pp_Var7;
  args *paVar8;
  float_t *in_R8;
  float_t fVar9;
  float_t fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  value_type vVar15;
  value_type F;
  args args;
  vec3 local_98;
  undefined4 uStack_8c;
  vec3 local_88;
  args local_7c;
  
  uVar1 = wo->x;
  uVar2 = wo->y;
  fVar11 = (float)*user_args + (float)uVar1;
  fVar12 = (float)((ulong)*user_args >> 0x20) + (float)uVar2;
  fVar13 = wo->z + *(float *)((long)user_args + 8);
  fVar14 = fVar13 * fVar13 + fVar11 * fVar11 + fVar12 * fVar12;
  if (fVar14 <= 0.0) {
    (**(code **)(*(long *)wi + 0x10))(this,wi);
    pfVar6 = extraout_RDX;
  }
  else {
    if (in_R8 == (float_t *)0x0) {
      local_98._0_8_ = (_func_int **)0x0;
      local_98.z = 1.0;
      microfacet::args::normalmap(&local_7c,&local_98,1.0,1.0,0.0);
    }
    else {
      paVar8 = &local_7c;
      for (lVar5 = 0x13; lVar5 != 0; lVar5 = lVar5 + -1) {
        (paVar8->mtra).r[0].x = *in_R8;
        in_R8 = in_R8 + 1;
        paVar8 = (args *)&(paVar8->mtra).r[0].y;
      }
    }
    fVar14 = 1.0 / SQRT(fVar14);
    local_88.y = fVar12 * fVar14;
    local_88.x = fVar11 * fVar14;
    local_88.z = fVar13 * fVar14;
    fVar9 = vndf((microfacet *)wi,&local_88,wo,&local_7c);
    fVar10 = gcd((microfacet *)wi,&local_88,wo,(vec3 *)user_args,&local_7c);
    fVar12 = fVar13 * fVar14 * wo->z + fVar11 * fVar14 * wo->x + fVar12 * fVar14 * wo->y;
    fVar11 = 0.0;
    if (0.0 <= fVar12) {
      fVar11 = fVar12;
    }
    fVar12 = 1.0;
    if (fVar11 <= 1.0) {
      fVar12 = fVar11;
    }
    (**(code **)(**(long **)&wi->z + 0x20))(&local_98);
    if (fVar10 <= 0.0) {
      (**(code **)(*(long *)wi + 0x10))(this,wi);
    }
    else {
      (this->super_brdf)._vptr_brdf = (_func_int **)local_98._0_8_;
      piVar4 = (impl *)operator_new(local_98._0_8_ << 2);
      (this->m_fresnel).m_f = piVar4;
      pp_Var3 = (this->super_brdf)._vptr_brdf;
      if (pp_Var3 != (_func_int **)0x0) {
        pp_Var7 = (_func_int **)0x0;
        do {
          *(float *)((long)&piVar4->_vptr_impl + (long)pp_Var7 * 4) =
               *(float *)(CONCAT44(uStack_8c,local_98.z) + (long)pp_Var7 * 4) *
               ((fVar9 * fVar10) / (fVar12 * 4.0));
          pp_Var7 = (_func_int **)((long)pp_Var7 + 1);
        } while (pp_Var3 != pp_Var7);
      }
    }
    operator_delete((void *)CONCAT44(uStack_8c,local_98.z));
    pfVar6 = extraout_RDX_00;
  }
  vVar15._M_data = pfVar6;
  vVar15._M_size = (size_t)this;
  return vVar15;
}

Assistant:

brdf::value_type
microfacet::eval(const vec3 &wi, const vec3 &wo, const void *user_args) const
{
	vec3 tmp = wi + wo;
	float_t nrm = dot(tmp, tmp);

	if (nrm > 0) {
		microfacet::args args =
			user_args ? *reinterpret_cast<const microfacet::args *>(user_args)
			          : microfacet::args::standard();
		vec3 wh = tmp * inversesqrt(nrm);
		float_t Dvis = vndf(wh, wi, args);
		float_t Gcd = gcd(wh, wi, wo, args);
		float_t zd = sat(dot(wh, wi));
		brdf::value_type F = m_fresnel->eval(zd);

		return Gcd > 0 ? F * ((Dvis * Gcd) / (4 * zd)) : zero_value();
	}

	return zero_value();
}